

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unesctrn.cpp
# Opt level: O0

UClassID __thiscall icu_63::UnescapeTransliterator::getDynamicClassID(UnescapeTransliterator *this)

{
  UClassID pvVar1;
  UnescapeTransliterator *this_local;
  
  pvVar1 = getStaticClassID();
  return pvVar1;
}

Assistant:

static UChar* copySpec(const UChar* spec) {
    int32_t len = 0;
    while (spec[len] != END) {
        ++len;
    }
    ++len;
    UChar *result = (UChar *)uprv_malloc(len*sizeof(UChar));
    // Check for memory allocation error. 
    if (result != NULL) {
    	uprv_memcpy(result, spec, (size_t)len*sizeof(result[0]));
    }
    return result;
}